

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall cppforth::Forth::block(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  long lVar1;
  Cell CVar2;
  element_type *peVar3;
  char cVar4;
  uint dst;
  iterator iVar5;
  basic_fstream<char,_std::char_traits<char>_> *__p;
  mapped_type *pmVar6;
  Cell u;
  shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> f;
  string fileContent;
  char buffer [1024];
  
  requireDStackDepth(this,1,"BLOCK");
  requireDStackAvailable(this,1,"BLOCK");
  this_00 = &this->dStack;
  u = ForthStack<unsigned_int>::getTop(this_00);
  if (u != 0) {
    iVar5 = std::
            _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_cppforth::Forth::BlockInfo>,_std::_Select1st<std::pair<const_unsigned_int,_cppforth::Forth::BlockInfo>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_cppforth::Forth::BlockInfo>_>_>
            ::find(&(this->blocksInProcess)._M_t,&u);
    if ((_Rb_tree_header *)iVar5._M_node ==
        &(this->blocksInProcess)._M_t._M_impl.super__Rb_tree_header) {
      __p = (basic_fstream<char,_std::char_traits<char>_> *)operator_new(0x210);
      std::fstream::fstream(__p,(string *)&this->blockFileName,_S_in|_S_bin);
      std::__shared_ptr<std::fstream,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<std::fstream,void>
                ((__shared_ptr<std::fstream,(__gnu_cxx::_Lock_policy)2> *)&f,__p);
      peVar3 = f.
               super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      cVar4 = std::__basic_file<char>::is_open();
      if (cVar4 != '\0') {
        std::istream::seekg((long)peVar3,(u - 1) * 0x400);
        std::istream::read((char *)f.
                                   super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr,(long)buffer);
        lVar1 = *(long *)(f.
                          super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr + 8);
        std::fstream::close();
        fileContent._M_dataplus._M_p = (pointer)&fileContent.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&fileContent,buffer,buffer + lVar1);
        ForthStack<unsigned_int>::setTop(this_00,(uint)fileContent._M_string_length);
        memAllocate(this);
        ForthStack<unsigned_int>::getTop(this_00);
        ForthStack<unsigned_int>::pop(this_00);
        dst = ForthStack<unsigned_int>::getTop(this_00);
        moveIntoDataSpace(this,dst,fileContent._M_dataplus._M_p,
                          CONCAT44(fileContent._M_string_length._4_4_,
                                   (uint)fileContent._M_string_length));
        CVar2 = u;
        pmVar6 = std::
                 map<unsigned_int,_cppforth::Forth::BlockInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_cppforth::Forth::BlockInfo>_>_>
                 ::operator[](&this->blocksInProcess,&u);
        pmVar6->blockNumber = CVar2;
        pmVar6->blockLocation = dst;
        *(undefined4 *)&pmVar6->blockModified = 0;
        std::__cxx11::string::~string((string *)&fileContent);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&f.
                  super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
    }
    else {
      ForthStack<unsigned_int>::setTop(this_00,*(uint *)&iVar5._M_node[1]._M_parent);
    }
    this->blockCurrent = u;
  }
  return;
}

Assistant:

void block(){
			REQUIRE_DSTACK_DEPTH(1, "BLOCK");
			REQUIRE_DSTACK_AVAILABLE(1, "BLOCK");
			Cell u=dStack.getTop();
			if(u>0){
				auto foundIt=blocksInProcess.find(u);
				if(foundIt!=blocksInProcess.end()){
					dStack.setTop((*foundIt).second.blockLocation);	
				} else {	
				std::shared_ptr<std::fstream> f{ new std::fstream(blockFileName, std::ios_base::in | std::ios_base::binary) };
					if (f->is_open()) {
						f->seekg(static_cast<size_t>(u-1)*1024L , std::ios_base::beg);
						char buffer[1024];
						f->read(buffer,1024);   // read from the file
						auto readBytes=f->gcount();
						f->close();
						std::string fileContent{buffer,static_cast<size_t>(readBytes)};
						// get memory
						dStack.setTop(fileContent.size());
						memAllocate();	
						auto ec=dStack.getTop();pop();
						// copy to memory
						auto address=dStack.getTop();
						moveIntoDataSpace(address,fileContent.c_str(),fileContent.size());
						// save block info
						struct BlockInfo newBlock {};
						newBlock.blockNumber = u;
						newBlock.blockLocation = address;
						newBlock.blockModified = false;
						blocksInProcess[u] = newBlock;
						// push address - address already on stack top
					}
				}
				blockCurrent = u;
			}
		}